

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client>::detach
          (WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *this,
          PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *from)

{
  if ((this->super_WeakFulfillerBase).inner != (PromiseRejector *)0x0) {
    (this->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    return;
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (getInner<T>() == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(getInner<T>() == &from);
      setInner<T>(nullptr);
    }
  }